

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::BufferSubData::BufferSubData
          (BufferSubData *this,SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer,GLenum target,
          GLintptr offset,GLsizeiptr size,bool useSync,bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40;
  
  Operation::Operation(&this->super_Operation,"BufferSubData",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__BufferSubData_003d5fc0;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr(&this->m_buffer,buffer);
  this->m_target = target;
  this->m_offset = offset;
  this->m_size = size;
  local_40.m_ptr = &((this->m_buffer).m_ptr)->super_Object;
  local_40.m_state = (this->m_buffer).m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_40);
  return;
}

Assistant:

BufferSubData::BufferSubData (SharedPtr<Buffer> buffer, GLenum target, GLintptr offset, GLsizeiptr size, bool useSync, bool serverSync)
	: Operation	("BufferSubData", useSync, serverSync)
	, m_buffer	(buffer)
	, m_target	(target)
	, m_offset	(offset)
	, m_size	(size)
{
	modifyGLObject(SharedPtr<Object>(m_buffer));
}